

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# distribution2d.cpp
# Opt level: O3

float __thiscall embree::Distribution2D::pdf(Distribution2D *this,Vec2f *p)

{
  uint uVar1;
  uint uVar2;
  float fVar3;
  float fVar4;
  
  uVar2 = (uint)((float)this->height * (p->field_0).field_0.y);
  uVar1 = (int)this->height - 1;
  if ((int)uVar2 < (int)uVar1) {
    uVar1 = uVar2;
  }
  uVar2 = 0;
  if (0 < (int)uVar1) {
    uVar2 = uVar1;
  }
  fVar3 = Distribution1D::pdf((this->xDists).
                              super__Vector_base<embree::Distribution1D,_std::allocator<embree::Distribution1D>_>
                              ._M_impl.super__Vector_impl_data._M_start + uVar2,
                              (p->field_0).field_0.x);
  fVar4 = Distribution1D::pdf(&this->yDist,(p->field_0).field_0.y);
  return fVar4 * fVar3;
}

Assistant:

float Distribution2D::pdf(const Vec2f& p) const {
    int idx = clamp(int(p.y*height),0,int(height)-1);
    return xDists[idx].pdf(p.x) * yDist.pdf(p.y);
  }